

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O3

bool flow::transform::eliminateLinearBr(IRHandler *handler)

{
  _List_node_base *p_Var1;
  BasicBlock *this;
  BasicBlock *bb;
  pointer ppBVar2;
  byte bVar3;
  TerminateInstr *pTVar4;
  long lVar5;
  byte bVar6;
  undefined8 in_RCX;
  _func_int **local_30;
  
  bVar6 = (byte)in_RCX;
  p_Var1 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)&handler->blocks_) {
      bVar3 = 0;
LAB_0014fb0f:
      return (bool)(bVar3 & bVar6);
    }
    this = (BasicBlock *)p_Var1[1]._M_next;
    pTVar4 = BasicBlock::getTerminator(this);
    if (pTVar4 != (TerminateInstr *)0x0) {
      in_RCX = 0;
      lVar5 = __dynamic_cast(pTVar4,&TerminateInstr::typeinfo,&BrInstr::typeinfo);
      if (lVar5 != 0) {
        bb = (BasicBlock *)**(undefined8 **)(lVar5 + 0x50);
        ppBVar2 = (bb->predecessors_).
                  super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = 1;
        if (((long)(bb->predecessors_).
                   super__Vector_base<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 == 8) &&
           (*ppBVar2 == this)) {
          BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffd0,(char *)this);
          if (local_30 != (_func_int **)0x0) {
            (**(code **)(*local_30 + 8))();
          }
          local_30 = (_func_int **)0x0;
          BasicBlock::merge_back(this,bb);
          bVar3 = 1;
          bVar6 = 1;
        }
        else {
          bVar6 = 0;
        }
        goto LAB_0014fb0f;
      }
    }
    bVar6 = (byte)in_RCX;
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool eliminateLinearBr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless linear br
    if (BrInstr* br = dynamic_cast<BrInstr*>(bb->getTerminator())) {
      if (br->targetBlock()->predecessors().size() != 1)
        return false;

      if (br->targetBlock()->predecessors().front() != bb)
        return false;

      // we are the only predecessor of BR's target block, so merge them
      BasicBlock* nextBB = br->targetBlock();

      // FLOW_TRACE("flow: eliminate linear BR-instruction from {} to {}", bb->name(), nextBB->name());

      // remove old terminator
      bb->remove(br);

      // merge nextBB
      bb->merge_back(nextBB);

      // destroy unused BB
      //bb->getHandler()->erase(nextBB);

      return true;
    }
  }

  return false;
}